

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_descriptor_array
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,int *fds,size_t nfds)

{
  size_t __size;
  int *piVar1;
  void *__ptr;
  ulong uVar2;
  uint8_t *p;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (nvp->nvp_type != 0xc) {
    __assert_fail("nvp->nvp_type == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3f5,
                  "const unsigned char *nvpair_unpack_descriptor_array(_Bool, nvpair_t *, const unsigned char *, size_t *, const int *, size_t)"
                 );
  }
  sVar4 = nvp->nvp_nitems;
  __size = sVar4 * 8;
  if ((nvp->nvp_datasize == __size) && (uVar5 = *leftp, sVar4 - 1 < __size && __size <= uVar5)) {
    __ptr = malloc(__size);
    uVar3 = 0;
    if (__ptr != (void *)0x0) {
      while( true ) {
        uVar5 = uVar5 - 8;
        if (sVar4 <= uVar3) {
          nvp->nvp_data = (uint64_t)__ptr;
          return (uchar *)(ulong *)ptr;
        }
        if (isbe) {
          uVar2 = be64dec(ptr);
        }
        else {
          uVar2 = *(ulong *)ptr;
        }
        if (((long)uVar2 < 0) || (nfds <= uVar2)) break;
        *(int *)((long)__ptr + uVar3 * 4) = fds[uVar2];
        ptr = (uchar *)((long)ptr + 8);
        *leftp = uVar5;
        uVar3 = (ulong)((int)uVar3 + 1);
        sVar4 = nvp->nvp_nitems;
      }
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      free(__ptr);
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_descriptor_array(bool isbe, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, const int *fds, size_t nfds)
{
	int64_t idx;
	size_t size;
	unsigned int ii;
	int *array;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR_ARRAY);

	size = sizeof(idx) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	array = (int *)nv_malloc(size);
	if (array == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		if (isbe)
			idx = be64dec(ptr);
		else
			idx = le64dec(ptr);

		if (idx < 0) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		if ((size_t)idx >= nfds) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		array[ii] = (uint64_t)fds[idx];

		ptr += sizeof(idx);
		*leftp -= sizeof(idx);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)array;

	return (ptr);
}